

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

_Bool Field_Grown(FIELD *field,int amount)

{
  short sVar1;
  int iVar2;
  char *pcVar3;
  FORM *form;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *__ptr;
  WINDOW_conflict *pWVar7;
  FIELD *pFVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *__src;
  char *__dest;
  
  if ((field != (FIELD *)0x0) && ((field->status & 8) != 0)) {
    iVar12 = (int)field->rows + field->nrow;
    iVar2 = field->drows;
    iVar10 = field->dcols;
    pcVar3 = field->buf;
    form = field->form;
    if ((form == (FORM *)0x0) || (((form->status & 1) == 0 || (form->current != field)))) {
      bVar4 = false;
    }
    else {
      Synchronize_Buffer(form);
      bVar4 = true;
    }
    if (iVar12 == 1) {
      iVar5 = field->cols * amount;
      iVar6 = field->maxgrow;
      iVar9 = iVar6 - field->dcols;
      if (iVar5 <= iVar9) {
        iVar9 = iVar5;
      }
      if (iVar6 == 0) {
        iVar9 = iVar5;
      }
      iVar9 = iVar9 + field->dcols;
      field->dcols = iVar9;
    }
    else {
      iVar5 = ((int)field->rows + field->nrow) * amount;
      iVar6 = field->maxgrow;
      iVar9 = iVar6 - field->drows;
      if (iVar5 <= iVar9) {
        iVar9 = iVar5;
      }
      if (iVar6 == 0) {
        iVar9 = iVar5;
      }
      iVar9 = iVar9 + field->drows;
      field->drows = iVar9;
    }
    if (iVar9 == iVar6) {
      *(byte *)&field->status = (byte)field->status & 0xf7;
    }
    lVar13 = (long)field->dcols * (long)field->drows;
    iVar9 = (int)lVar13;
    sVar1 = field->nbuf;
    __ptr = (char *)malloc((long)((sVar1 + 1) * (iVar9 + 1)));
    if (__ptr != (char *)0x0) {
      field->buf = __ptr;
      if (-1 < sVar1) {
        iVar6 = iVar10 * iVar2;
        lVar11 = -1;
        __src = pcVar3;
        do {
          lVar11 = lVar11 + 1;
          __dest = field->buf + ((long)field->dcols * (long)field->drows + 1) * lVar11;
          memcpy(__dest,__src,(long)iVar6);
          if (iVar6 < iVar9) {
            memset(__dest + iVar6,0x20,(long)(iVar9 - iVar6));
          }
          __dest[lVar13] = '\0';
          __src = __src + (iVar6 + 1);
        } while (lVar11 < field->nbuf);
      }
      if (bVar4) {
        pWVar7 = (WINDOW_conflict *)newpad(field->drows,field->dcols);
        if (pWVar7 == (WINDOW_conflict *)0x0) {
          field->dcols = iVar10;
          field->drows = iVar2;
          field->buf = pcVar3;
          if (iVar12 == 1) {
            iVar2 = iVar10;
          }
          if (iVar2 != field->maxgrow) {
            *(byte *)&field->status = (byte)field->status | 8;
          }
          free(__ptr);
          return false;
        }
        if (form == (FORM *)0x0) {
          __assert_fail("form!=(FORM *)0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                        ,0x21a,"_Bool Field_Grown(FIELD *, int)");
        }
        delwin(form->w);
        form->w = pWVar7;
        wbkgdset(pWVar7,field->back | field->pad);
        wattrset(form->w,field->fore);
        werase(form->w);
        Buffer_To_Window(field,form->w);
        pWVar7 = form->w;
        if (pWVar7 == (WINDOW_conflict *)0x0) {
          iVar10 = -1;
        }
        else {
          iVar10 = pWVar7->_maxy + 1;
        }
        wtouchln(pWVar7,0,iVar10,0);
        wmove(form->w,form->currow,form->curcol);
      }
      free(pcVar3);
      pFVar8 = field->link;
      if (pFVar8 != field) {
        pcVar3 = field->buf;
        iVar10 = field->drows;
        iVar2 = field->dcols;
        do {
          pFVar8->buf = pcVar3;
          pFVar8->drows = iVar10;
          pFVar8->dcols = iVar2;
          pFVar8 = pFVar8->link;
        } while (pFVar8 != field);
        return true;
      }
      return true;
    }
    field->dcols = iVar10;
    field->drows = iVar2;
    if (iVar12 == 1) {
      iVar2 = iVar10;
    }
    if (iVar2 != iVar6) {
      *(byte *)&field->status = (byte)field->status | 8;
    }
  }
  return false;
}

Assistant:

static bool Field_Grown(FIELD * field, int amount)
{
  bool result = FALSE;

  if (field && Growable(field))
    {
      bool single_line_field = Single_Line_Field(field);
      int old_buflen = Buffer_Length(field);
      int new_buflen;
      int old_dcols = field->dcols;
      int old_drows = field->drows;
      char *oldbuf  = field->buf;
      char *newbuf;

      int growth;
      FORM *form = field->form;
      bool need_visual_update = ((form != (FORM *)0)      &&
                                 (form->status & _POSTED) &&
                                 (form->current==field));
      
      if (need_visual_update)
        Synchronize_Buffer(form);
      
      if (single_line_field)
        {
          growth = field->cols * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->dcols,growth);
          field->dcols += growth;
          if (field->dcols == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      else
        {
          growth = (field->rows + field->nrow) * amount;
          if (field->maxgrow)
            growth = Minimum(field->maxgrow - field->drows,growth);
          field->drows += growth;
          if (field->drows == field->maxgrow)
            field->status &= ~_MAY_GROW;
        }
      /* drows, dcols changed, so we get really the new buffer length */
      new_buflen = Buffer_Length(field);
      newbuf=(char *)malloc((size_t)Total_Buffer_Size(field));
      if (!newbuf)
        { /* restore to previous state */
          field->dcols = old_dcols;
          field->drows = old_drows;
          if (( single_line_field && (field->dcols!=field->maxgrow)) ||
              (!single_line_field && (field->drows!=field->maxgrow)))
            field->status |= _MAY_GROW;
          return FALSE;
        }
      else
        { /* Copy all the buffers. This is the reason why we can't
             just use realloc().
             */
          int i;
          char *old_bp;
          char *new_bp;
          
          field->buf = newbuf;
          for(i=0;i<=field->nbuf;i++)
            {
              new_bp = Address_Of_Nth_Buffer(field,i);
              old_bp = oldbuf + i*(1+old_buflen);
              memcpy(new_bp,old_bp,(size_t)old_buflen);
              if (new_buflen > old_buflen)
                memset(new_bp + old_buflen,C_BLANK,
                       (size_t)(new_buflen - old_buflen));
              *(new_bp + new_buflen) = '\0';
            }

          if (need_visual_update)
            {         
              WINDOW *new_window = newpad(field->drows,field->dcols);
              if (!new_window)
                { /* restore old state */
                  field->dcols = old_dcols;
                  field->drows = old_drows;
                  field->buf   = oldbuf;
                  if (( single_line_field              && 
                        (field->dcols!=field->maxgrow)) ||
                      (!single_line_field              && 
                       (field->drows!=field->maxgrow)))
                    field->status |= _MAY_GROW;
                  free( newbuf );
                  return FALSE;
                }
              assert(form!=(FORM *)0);
              delwin(form->w);
              form->w = new_window;
              Set_Field_Window_Attributes(field,form->w);
              werase(form->w);
              Buffer_To_Window(field,form->w);
              untouchwin(form->w);
              wmove(form->w,form->currow,form->curcol);
            }

          free(oldbuf);
          /* reflect changes in linked fields */
          if (field != field->link)
            {
              FIELD *linked_field;
              for(linked_field = field->link;
                  linked_field!= field;
                  linked_field = linked_field->link)
                {
                  linked_field->buf   = field->buf;
                  linked_field->drows = field->drows;
                  linked_field->dcols = field->dcols;
                }
            }
          result = TRUE;
        }       
    }
  return(result);
}